

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void * msort(void *list,void *next,_func_int_varargs *cmp)

{
  void *pvVar1;
  ulong uVar2;
  size_t offset;
  long lVar3;
  char *set [30];
  undefined8 local_118 [31];
  
  memset(local_118,0,0xf0);
  offset = (long)next - (long)list;
  do {
    if (list == (void *)0x0) {
      lVar3 = 0;
      pvVar1 = (void *)0x0;
      do {
        if ((void *)local_118[lVar3] != (void *)0x0) {
          pvVar1 = merge((void *)local_118[lVar3],pvVar1,cmp,offset);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x1e);
      return pvVar1;
    }
    pvVar1 = *(void **)(offset + (long)list);
    *(undefined8 *)(offset + (long)list) = 0;
    uVar2 = 0;
    do {
      if ((void *)local_118[uVar2] == (void *)0x0) goto LAB_001055cc;
      list = merge(list,(void *)local_118[uVar2],cmp,offset);
      local_118[uVar2] = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x1d);
    uVar2 = 0x1d;
LAB_001055cc:
    local_118[uVar2 & 0xffffffff] = list;
    list = pvVar1;
  } while( true );
}

Assistant:

static void *msort(void *list,void *next,int (*cmp)())
{
  size_t offset;
  char *ep;
  char *set[LISTSIZE];
  int i;
  offset = (size_t)next - (size_t)list;
  for(i=0; i<LISTSIZE; i++) set[i] = 0;
  while( list ){
    ep = list;
    list = NEXT(list);
    NEXT(ep) = 0;
    for(i=0; i<LISTSIZE-1 && set[i]!=0; i++){
      ep = merge(ep,set[i],cmp,offset);
      set[i] = 0;
    }
    set[i] = ep;
  }
  ep = 0;
  for(i=0; i<LISTSIZE; i++) if( set[i] ) ep = merge(set[i],ep,cmp,offset);
  return ep;
}